

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QRegularExpressionMatch __thiscall
QRegularExpression::matchView
          (QRegularExpression *this,QStringView subjectView,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  QRegularExpressionMatchPrivate *priv;
  QRegularExpression *re;
  undefined4 in_register_00000084;
  Int in_stack_00000008;
  
  re = (QRegularExpression *)subjectView.m_size;
  QRegularExpressionPrivate::compilePattern((re->d).d.ptr);
  priv = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  (priv->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QRegularExpression(&priv->regularExpression,re);
  (priv->subjectStorage).d.d = (Data *)0x0;
  (priv->subjectStorage).d.ptr = (char16_t *)0x0;
  (priv->subjectStorage).d.size = 0;
  (priv->subject).m_size = (qsizetype)subjectView.m_data;
  (priv->subject).m_data = (storage_type_conflict *)offset;
  priv->matchType =
       (MatchType)
       matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
       super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  (priv->matchOptions).super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
  super_QFlagsStorage<QRegularExpression::MatchOption>.i = in_stack_00000008;
  (priv->capturedOffsets).d.d = (Data *)0x0;
  (priv->capturedOffsets).d.ptr = (longlong *)0x0;
  *(undefined8 *)((long)&(priv->capturedOffsets).d.ptr + 7) = 0;
  *(undefined8 *)((long)&(priv->capturedOffsets).d.size + 7) = 0;
  QRegularExpressionPrivate::doMatch
            ((re->d).d.ptr,priv,CONCAT44(in_register_00000084,matchType),CheckSubjectString,
             (QRegularExpressionMatchPrivate *)0x0);
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)this,priv);
  return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
}

Assistant:

QRegularExpressionMatch QRegularExpression::matchView(QStringView subjectView,
                                                      qsizetype offset,
                                                      MatchType matchType,
                                                      MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   QString(),
                                                   subjectView,
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}